

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
mjs::parser::syntax_error
          (parser *this,char *function,int line,source_extend *extend,wstring_view message)

{
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> __str;
  wostream *pwVar1;
  wchar_t *pwVar2;
  runtime_error *this_00;
  undefined4 in_register_00000014;
  wstring_view wVar3;
  wstring local_248 [32];
  undefined1 local_228 [16];
  string local_218;
  source_extend *local_1f8;
  wchar_t *pwStack_1f0;
  wchar_t *local_1e8;
  wstring_view *local_1e0;
  wstring local_1d8;
  wostringstream local_1a8 [8];
  wostringstream oss;
  source_extend *extend_local;
  int line_local;
  char *function_local;
  wstring_view message_local;
  
  std::__cxx11::wostringstream::wostringstream(local_1a8);
  pwVar1 = std::operator<<((wostream *)local_1a8,"Syntax error in ");
  pwVar1 = std::operator<<(pwVar1,(char *)this);
  pwVar1 = std::operator<<(pwVar1," line ");
  pwVar1 = (wostream *)std::wostream::operator<<(pwVar1,(int)function);
  pwVar1 = std::operator<<(pwVar1," at \"");
  wVar3 = source_extend::source_view((source_extend *)CONCAT44(in_register_00000014,line));
  local_1e0 = (wstring_view *)wVar3._M_str;
  pwVar2 = (wchar_t *)wVar3._M_len;
  local_1e8 = pwVar2;
  cpp_quote_abi_cxx11_(&local_1d8,(mjs *)&local_1e8,local_1e0);
  pwVar1 = std::operator<<(pwVar1,(wstring *)&local_1d8);
  pwVar1 = std::operator<<(pwVar1,"\": ");
  __str._M_str = (wchar_t *)message._M_len;
  __str._M_len = (size_t)extend;
  local_1f8 = extend;
  pwStack_1f0 = (wchar_t *)message._M_len;
  std::operator<<(pwVar1,__str);
  std::__cxx11::wstring::~wstring((wstring *)&local_1d8);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::wostringstream::str();
  local_228 = std::__cxx11::wstring::operator_cast_to_basic_string_view(local_248);
  wVar3._M_len = local_228._8_8_;
  wVar3._M_str = pwVar2;
  unicode::utf16_to_utf8_abi_cxx11_(&local_218,local_228._0_8_,wVar3);
  std::runtime_error::runtime_error(this_00,(string *)&local_218);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

[[noreturn]] static void syntax_error(const char* function, int line, const source_extend& extend, const std::wstring_view message) {
        std::wostringstream oss;
        oss << "Syntax error in " << function  << " line " << line << " at \"" << cpp_quote(extend.source_view()) << "\": " << message;
        throw std::runtime_error(unicode::utf16_to_utf8(oss.str()));
    }